

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Coap::SendEmptyChanged
          (Error *__return_storage_ptr__,Coap *this,Request *aRequest)

{
  char cVar1;
  char *to;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_78;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if ((undefined1  [12])((undefined1  [12])aRequest->mHeader & (undefined1  [12])0xc) ==
      (undefined1  [12])0x0) {
    SendHeaderResponse(__return_storage_ptr__,this,kChanged,aRequest);
  }
  else {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the CoAP request is not Confirmable";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    from = "the CoAP request is not Confirmable";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_001c33f2;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_58);
    }
LAB_001c33f2:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"the CoAP request is not Confirmable",(string_view)ZEXT816(0x23),
               args);
    __return_storage_ptr__->mCode = kInvalidArgs;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendEmptyChanged(const Request &aRequest)
{
    if (!aRequest.IsConfirmable())
    {
        return ERROR_INVALID_ARGS("the CoAP request is not Confirmable");
    }
    return SendHeaderResponse(Code::kChanged, aRequest);
}